

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa_common.h
# Opt level: O1

void play_floatbuffer(snd_pcm_t *device,snd_pcm_format_t format,size_t period_size,float preamp,
                     float *buffer,void *alsabuffer)

{
  undefined1 *alsabuffer_00;
  snd_pcm_t *psVar1;
  size_t sVar2;
  snd_pcm_format_t format_00;
  uint32_t rate;
  xm_context_t *pxVar3;
  bool bVar4;
  byte bVar5;
  uint8_t uVar6;
  _Bool _Var7;
  uint16_t uVar8;
  uint16_t uVar9;
  ushort channel;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  undefined4 extraout_var;
  time_t tVar15;
  size_t __len;
  char *pcVar16;
  float *pfVar17;
  size_t extraout_RDX;
  ulong uVar18;
  char cVar19;
  ulong uVar20;
  float *pfVar21;
  long lVar22;
  char **ppcVar23;
  ulong uVar24;
  undefined2 uVar25;
  ulong uVar26;
  bool bVar27;
  float extraout_XMM0_Da;
  float fVar28;
  ulong auStackY_1e8 [7];
  undefined8 uStack_198;
  float fStack_190;
  undefined2 uStack_18b;
  undefined4 uStack_189;
  undefined2 uStack_185;
  size_t sStack_140;
  ulong uStack_138;
  long lStack_130;
  ulong uStack_128;
  ulong uStack_120;
  ulong uStack_118;
  undefined1 *puStack_110;
  ulong uStack_108;
  undefined1 *puStack_100;
  snd_pcm_t *psStack_f8;
  size_t sStack_f0;
  float *pfStack_e8;
  ulong uStack_e0;
  snd_pcm_format_t sStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  float fStack_c4;
  float fStack_c0;
  snd_pcm_format_t sStack_bc;
  snd_pcm_t *psStack_b8;
  ulong uStack_b0;
  char **ppcStack_a8;
  uint64_t uStack_a0;
  ulong uStack_98;
  ulong uStack_90;
  uint32_t uStack_84;
  ulong uStack_80;
  ushort uStack_78;
  ushort uStack_76;
  float fStack_74;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  uint16_t uStack_52;
  uint uStack_50;
  byte bStack_4a;
  byte bStack_49;
  xm_context_t *pxStack_48;
  byte bStack_39;
  snd_pcm_t *psStack_38;
  
  if (((format == SND_PCM_FORMAT_FLOAT) && (preamp == 1.0)) && (!NAN(preamp))) {
    format = snd_pcm_writei(device,buffer);
    if (SND_PCM_FORMAT_UNKNOWN < format) {
      return;
    }
    iVar10 = snd_pcm_recover(device,format,0);
    if (-1 < iVar10) {
      return;
    }
    play_floatbuffer_cold_2();
    period_size = extraout_RDX;
    preamp = extraout_XMM0_Da;
  }
  if (format == SND_PCM_FORMAT_S16) {
    if (period_size * 2 != 0) {
      lVar22 = 0;
      do {
        fVar28 = buffer[lVar22] * preamp;
        uVar25 = 0x7fff;
        if ((fVar28 <= 1.0) && (uVar25 = 0x8001, -1.0 <= fVar28)) {
          uVar25 = (undefined2)(int)(fVar28 * 32767.0);
        }
        *(undefined2 *)((long)alsabuffer + lVar22 * 2) = uVar25;
        lVar22 = lVar22 + 1;
      } while (period_size * 2 != lVar22);
    }
  }
  else if (format == SND_PCM_FORMAT_S32) {
    if (period_size * 2 != 0) {
      lVar22 = 0;
      do {
        fVar28 = buffer[lVar22] * preamp;
        iVar10 = 0x7fffffff;
        if ((fVar28 <= 1.0) && (iVar10 = -0x7fffffff, -1.0 <= fVar28)) {
          iVar10 = (int)(fVar28 * 2.1474836e+09);
        }
        *(int *)((long)alsabuffer + lVar22 * 4) = iVar10;
        lVar22 = lVar22 + 1;
      } while (period_size * 2 != lVar22);
    }
  }
  else if ((format == SND_PCM_FORMAT_FLOAT) && (period_size * 2 != 0)) {
    lVar22 = 0;
    do {
      *(float *)((long)alsabuffer + lVar22 * 4) = buffer[lVar22] * preamp;
      lVar22 = lVar22 + 1;
    } while (period_size * 2 != lVar22);
  }
  uVar11 = snd_pcm_writei(device,alsabuffer);
  if (-1 < (int)uVar11) {
    return;
  }
  ppcVar23 = (char **)(ulong)uVar11;
  uVar11 = snd_pcm_recover(device,ppcVar23,0);
  if (-1 < (int)uVar11) {
    return;
  }
  play_floatbuffer_cold_1();
  pfVar17 = &fStack_190;
  uStack_a0 = 0;
  pfVar21 = &fStack_190;
  psStack_38 = device;
  if (uVar11 != 1) {
    pcVar16 = ppcVar23[1];
    uStack_198 = 0x1038b8;
    iVar10 = strcmp(pcVar16,"-h");
    pfVar21 = &fStack_190;
    if (iVar10 != 0) {
      uStack_198 = 0x1038cf;
      iVar10 = strcmp(pcVar16,"--help");
      pfVar21 = &fStack_190;
      if (iVar10 != 0) {
        uStack_80 = (ulong)(int)uVar11;
        ppcStack_a8 = ppcVar23;
        uStack_70 = (ulong)uVar11;
        if (uVar11 == 0) {
          fStack_74 = 1.0;
          uStack_60 = 1;
          uVar14 = 1;
          uVar20 = 0;
        }
        else {
          uVar14 = 1;
          uStack_60 = 1;
          fStack_74 = 1.0;
          uStack_68 = 0;
          do {
            pcVar16 = ppcVar23[uVar14];
            uStack_198 = 0x103930;
            iVar10 = strcmp(pcVar16,"--");
            if (iVar10 == 0) {
              uVar14 = uVar14 + 1;
              uVar20 = uStack_68;
              goto LAB_00103a6d;
            }
            uStack_198 = 0x103943;
            iVar10 = strcmp(pcVar16,"--preamp");
            if (iVar10 == 0) {
              uVar20 = uVar14 + 1;
              if (uVar20 == uStack_80) goto LAB_00104485;
              uStack_198 = 0x1039fd;
              fStack_74 = strtof(ppcVar23[uVar14 + 1],(char **)0x0);
            }
            else {
              uStack_198 = 0x10395a;
              iVar10 = strcmp(pcVar16,"--loop");
              if (iVar10 == 0) {
                uVar20 = uVar14 + 1;
                pfVar21 = &fStack_190;
                if (uVar20 == uStack_80) goto LAB_00104498;
                uStack_198 = 0x103a22;
                uStack_60 = strtol(ppcVar23[uVar14 + 1],(char **)0x0,0);
              }
              else {
                uStack_198 = 0x103971;
                iVar10 = strcmp(pcVar16,"--random");
                if (iVar10 == 0) {
                  uStack_68 = CONCAT71((int7)(CONCAT44(extraout_var,iVar10) >> 8),1);
                  uVar20 = uVar14;
                }
                else {
                  uStack_198 = 0x103988;
                  iVar10 = strcmp(pcVar16,"--device");
                  if (iVar10 != 0) {
                    uStack_198 = 0x10399b;
                    iVar10 = strcmp(pcVar16,"--buffer-size");
                    if (iVar10 != 0) {
                      uStack_198 = 0x1039ae;
                      iVar10 = strcmp(pcVar16,"--period-size");
                      if (iVar10 != 0) {
                        uStack_198 = 0x1039c1;
                        iVar10 = strcmp(pcVar16,"--rate");
                        if (iVar10 != 0) {
                          uStack_198 = 0x1039d4;
                          iVar10 = strcmp(pcVar16,"--format");
                          uVar20 = uStack_68;
                          if (iVar10 != 0) goto LAB_00103a6d;
                        }
                      }
                    }
                  }
                  uVar20 = uVar14 + 1;
                }
              }
            }
            uVar14 = uVar20 + 1;
          } while (uVar14 < uStack_80);
          uVar14 = 1;
          uVar20 = uStack_68;
        }
LAB_00103a6d:
        ppcVar23 = ppcStack_a8;
        uStack_90 = uVar14;
        if ((uVar20 & 1) != 0) {
          uStack_198 = 0x103a83;
          tVar15 = time((time_t *)0x0);
          uStack_198 = 0x103a8a;
          srand((uint)tVar15);
          uVar14 = uStack_90;
          uVar20 = (ulong)((int)uStack_70 + -1);
          if (uStack_90 < uVar20) {
            lVar22 = 1 - uStack_90;
            do {
              uStack_198 = 0x103ab2;
              iVar10 = rand();
              uVar18 = (ulong)(long)iVar10 % (lVar22 + uVar20);
              pcVar16 = ppcVar23[uVar20];
              ppcVar23[uVar20] = ppcVar23[uVar14 + uVar18];
              ppcVar23[uVar14 + uVar18] = pcVar16;
              uVar20 = uVar20 - 1;
            } while (uVar14 < uVar20);
          }
        }
        auStackY_1e8[6] = 0x103b0f;
        init_alsa_device((int)uStack_70,ppcVar23,0x80,0x400,0,&psStack_f8,&sStack_140,&uStack_84,
                         &sStack_d8);
        uVar20 = sStack_140 * 8 + 0xf & 0xfffffffffffffff0;
        pfStack_e8 = (float *)((long)&fStack_190 - uVar20);
        pfVar17 = (float *)((long)pfStack_e8 - uVar20);
        puStack_110 = (undefined1 *)pfVar17;
        puStack_100 = (undefined1 *)&fStack_190;
        *(undefined8 *)((long)pfVar17 + -8) = 0x103b57;
        tcgetattr(0,(termios *)&previousflags);
        *(undefined8 *)((long)pfVar17 + -8) = 0x103b63;
        atexit(restoreterm);
        customflags.c_iflag = previousflags.c_iflag;
        customflags.c_oflag = previousflags.c_oflag;
        customflags.c_line = previousflags.c_line;
        customflags.c_cc[0] = previousflags.c_cc[0];
        customflags.c_cc[1] = previousflags.c_cc[1];
        customflags.c_cc[2] = previousflags.c_cc[2];
        customflags.c_cc[3] = previousflags.c_cc[3];
        customflags.c_cc[4] = previousflags.c_cc[4];
        customflags.c_cc[5] = previousflags.c_cc[5];
        customflags.c_cc[6] = previousflags.c_cc[6];
        customflags.c_cc[7] = previousflags.c_cc[7];
        customflags.c_cc[8] = previousflags.c_cc[8];
        customflags.c_cc[9] = previousflags.c_cc[9];
        customflags.c_cc[10] = previousflags.c_cc[10];
        customflags.c_cc[0xb] = previousflags.c_cc[0xb];
        customflags.c_cc[0xc] = previousflags.c_cc[0xc];
        customflags.c_cc[0xd] = previousflags.c_cc[0xd];
        customflags.c_cc[0xe] = previousflags.c_cc[0xe];
        customflags.c_cc[0xf] = previousflags.c_cc[0xf];
        customflags.c_cc[0x10] = previousflags.c_cc[0x10];
        customflags.c_cc[0x11] = previousflags.c_cc[0x11];
        customflags.c_cc[0x12] = previousflags.c_cc[0x12];
        customflags.c_cc[0x13] = previousflags.c_cc[0x13];
        customflags.c_cc[0x14] = previousflags.c_cc[0x14];
        customflags.c_cc[0x15] = previousflags.c_cc[0x15];
        customflags.c_cc[0x16] = previousflags.c_cc[0x16];
        customflags.c_cc[0x17] = previousflags.c_cc[0x17];
        customflags.c_cc[0x18] = previousflags.c_cc[0x18];
        customflags.c_cc[0x19] = previousflags.c_cc[0x19];
        customflags.c_cc[0x1a] = previousflags.c_cc[0x1a];
        customflags.c_cc[0x1b] = previousflags.c_cc[0x1b];
        customflags.c_cc[0x1c] = previousflags.c_cc[0x1c];
        customflags.c_cc[0x1d] = previousflags.c_cc[0x1d];
        customflags.c_cc[0x1e] = previousflags.c_cc[0x1e];
        customflags.c_cc[0x1f] = previousflags.c_cc[0x1f];
        customflags._49_3_ = previousflags._49_3_;
        customflags.c_ispeed = previousflags.c_ispeed;
        customflags.c_ospeed = previousflags.c_ospeed;
        customflags._8_8_ = previousflags._8_8_ & 0xffffffb5ffffffff | 0x4000000000;
        *(undefined8 *)((long)pfVar17 + -8) = 0x103bbd;
        tcsetattr(0,0,(termios *)&customflags);
        if (uVar14 < uStack_80) {
          uStack_70 = 0;
          uStack_50 = 0;
          uStack_98 = 0;
          uVar14 = uStack_90;
LAB_00103be5:
          rate = uStack_84;
          bStack_39 = 0;
          pcVar16 = ppcStack_a8[uVar14];
          *(undefined8 *)((long)pfVar17 + -8) = 0x103c01;
          iVar10 = open(pcVar16,0);
          if (iVar10 != -1) {
            *(undefined8 *)((long)pfVar17 + -8) = 0x103c1a;
            __len = lseek(iVar10,0,2);
            if (__len == 0xffffffffffffffff) {
              *(undefined8 *)((long)pfVar17 + -8) = 0x1043ff;
              main_cold_7();
              goto LAB_00103c7a;
            }
            *(undefined8 *)((long)pfVar17 + -8) = 0x103c41;
            pcVar16 = (char *)mmap((void *)0x0,__len,1,1,iVar10,0);
            if (pcVar16 != (char *)0xffffffffffffffff) {
              *(undefined8 *)((long)pfVar17 + -8) = 0x103c60;
              iVar12 = xm_create_context_safe(&pxStack_48,pcVar16,__len,rate);
              if (iVar12 != 0) {
                if (iVar12 != 1) {
                  if (iVar12 == 2) {
                    *(undefined8 *)((long)pfVar17 + -8) = 0x10446d;
                    main_cold_3();
                    goto LAB_0010446d;
                  }
                  goto LAB_00104472;
                }
                *(undefined8 *)((long)pfVar17 + -8) = 0x104412;
                main_cold_4();
              }
              *(undefined8 *)((long)pfVar17 + -8) = 0x103c73;
              munmap(pcVar16,__len);
              *(undefined8 *)((long)pfVar17 + -8) = 0x103c7a;
              close(iVar10);
              goto LAB_00103c7a;
            }
LAB_0010446d:
            *(undefined8 *)((long)pfVar17 + -8) = 0x104472;
            main_cold_6();
LAB_00104472:
            *(undefined8 *)((long)pfVar17 + -8) = 0x104477;
            main_cold_5();
            goto LAB_00104477;
          }
          *(undefined8 *)((long)pfVar17 + -8) = 0x1043e5;
          main_cold_8();
LAB_00103c7a:
          pxVar3 = pxStack_48;
          if (pxStack_48 != (xm_context_t *)0x0) {
            uVar6 = (uint8_t)uStack_60;
            uStack_b0 = uVar14;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103ca2;
            xm_set_max_loop_count(pxVar3,uVar6);
            pxVar3 = pxStack_48;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cab;
            uVar8 = xm_get_number_of_patterns(pxVar3);
            pxVar3 = pxStack_48;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cb6;
            uVar9 = xm_get_number_of_channels(pxVar3);
            pxVar3 = pxStack_48;
            uStack_68 = CONCAT62(uStack_68._2_6_,uVar9);
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cc3;
            uStack_52 = xm_get_module_length(pxVar3);
            pxVar3 = pxStack_48;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cd0;
            xm_get_module_name(pxVar3);
            pxVar3 = pxStack_48;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cdc;
            pcVar16 = xm_get_tracker_name(pxVar3);
            *(undefined8 *)((long)pfVar17 + -8) = 0x103cf8;
            printf("==> Playing: %s\n");
            if (pcVar16 != (char *)0x0) {
              *(undefined8 *)((long)pfVar17 + -8) = 0x103d0e;
              printf("==> Tracker: %s\n");
            }
            psVar1 = psStack_f8;
            *(undefined8 *)((long)pfVar17 + -8) = 0x103d1d;
            iVar10 = snd_pcm_prepare(psVar1);
            uVar14 = uStack_60;
            if (-1 < iVar10) {
LAB_00103d40:
              psStack_b8 = psVar1;
              uStack_108 = uStack_68 & 0xffff;
              uStack_e0 = (ulong)uStack_84;
              uStack_c8 = (uint)uStack_52;
              uStack_128 = (ulong)(uStack_84 * 0xe10);
              fStack_c4 = (float)uStack_128;
              uStack_120 = (ulong)uVar8;
              fStack_c0 = (float)uStack_e0;
              uStack_118 = (ulong)(uStack_84 * 0x3c);
              sStack_f0 = sStack_140;
              sStack_bc = sStack_d8;
              bVar27 = false;
LAB_00103dc4:
              do {
                bVar4 = bVar27;
                pxVar3 = pxStack_48;
                if (bVar4) goto LAB_00104388;
                if (uVar14 != 0) {
                  *(undefined8 *)((long)pfVar17 + -8) = 0x103ddd;
                  bVar5 = xm_get_loop_count(pxVar3);
                  if (uVar14 <= bVar5) goto LAB_00104388;
                }
                get_command_f._112_8_ = 0;
                get_command_f._120_8_ = 0;
                get_command_f._96_8_ = 0;
                get_command_f._104_8_ = 0;
                get_command_f._80_8_ = 0;
                get_command_f._88_8_ = 0;
                get_command_f._64_8_ = 0;
                get_command_f._72_8_ = 0;
                get_command_f._48_8_ = 0;
                get_command_f._56_8_ = 0;
                get_command_f._32_8_ = 0;
                get_command_f._40_8_ = 0;
                get_command_f._16_8_ = 0;
                get_command_f._24_8_ = 0;
                get_command_f._0_8_ = 0;
                get_command_f._8_8_ = 0;
                *(undefined8 *)((long)pfVar17 + -8) = 0x103e33;
                iVar12 = fileno(_stdin);
                *(undefined8 *)((long)pfVar17 + -8) = 0x103e55;
                iVar13 = fileno(_stdin);
                iVar10 = iVar13 + 0x3f;
                if (-1 < iVar13) {
                  iVar10 = iVar13;
                }
                *(ulong *)(get_command_f + (long)(iVar10 >> 6) * 8) =
                     *(ulong *)(get_command_f + (long)(iVar10 >> 6) * 8) |
                     1L << ((byte)iVar12 & 0x3f);
                get_command_t._0_8_ = 0;
                get_command_t._8_8_ = 0;
                uVar11 = 0;
                *(undefined8 *)((long)pfVar17 + -8) = 0x103e8c;
                iVar10 = select(1,(fd_set *)get_command_f,(fd_set *)0x0,(fd_set *)0x0,
                                (timeval *)get_command_t);
                if (0 < iVar10) {
                  *(undefined8 *)((long)pfVar17 + -8) = 0x103e95;
                  uVar11 = getchar();
                }
                pxVar3 = pxStack_48;
                psVar1 = psStack_b8;
                cVar19 = (char)uVar11;
                bVar27 = true;
                if (cVar19 != 'n') {
                  uVar11 = uVar11 & 0xff;
                  if (uVar11 < 0x6c) {
                    if (uVar11 == 0x20) {
                      uVar20 = uStack_70 & 0xffffffff ^ 1;
                      if ((uStack_70 & 1) == 0) {
                        *(undefined8 *)((long)pfVar17 + -8) = 0x103fb5;
                        iVar10 = snd_pcm_pause(psVar1,1);
                        if (iVar10 < 0) {
                          *(undefined8 *)((long)pfVar17 + -8) = 0x103fc1;
                          iVar10 = snd_pcm_drain(psVar1);
                          if (iVar10 < 0) {
                            *(undefined8 *)((long)pfVar17 + -8) = 0x103fd1;
                            iVar10 = snd_pcm_recover(psVar1,iVar10,0);
                            if (iVar10 < 0) goto LAB_001044aa;
                          }
                        }
                        uStack_185 = 0x2d;
                        _fStack_190 = 0x4150202d2d;
                        uStack_18b = 0x5355;
                        uStack_189 = 0x2d204445;
                        uStack_98 = 0xffffffffffffffff;
                        uStack_70 = uVar20;
                      }
                      else {
                        uStack_50 = (uint)CONCAT71((int7)(uStack_70 >> 8),1);
                        uStack_98 = 0;
                        uStack_70 = uVar20;
                      }
                    }
                    else if (uVar11 == 0x3c) {
                      if (bStack_39 != 0) {
                        if (uVar14 != 0) {
                          *(undefined8 *)((long)pfVar17 + -8) = 0x103f53;
                          xm_set_max_loop_count(pxVar3,'\0');
                        }
                        pxVar3 = pxStack_48;
                        uVar6 = bStack_39 - 1;
                        *(undefined8 *)((long)pfVar17 + -8) = 0x103f68;
                        xm_seek(pxVar3,uVar6,'\0',0);
                        uVar14 = 0;
                      }
                    }
                    else {
                      if (uVar11 != 0x3e) goto LAB_00103f94;
                      if (bStack_39 < uStack_52) {
                        uVar6 = bStack_39 + 1;
                        *(undefined8 *)((long)pfVar17 + -8) = 0x103f12;
                        xm_seek(pxVar3,uVar6,'\0',0);
                      }
                    }
                  }
                  else if (uVar11 == 0x6c) {
                    bVar27 = uVar14 == 0;
                    uVar14 = (ulong)bVar27;
                    *(undefined8 *)((long)pfVar17 + -8) = 0x103f83;
                    xm_set_max_loop_count(pxVar3,bVar27);
                  }
                  else {
                    if (uVar11 == 0x70) {
                      if (uStack_b0 == uStack_90) {
LAB_0010445c:
                        *(undefined8 *)((long)pfVar17 + -8) = 0x104463;
                        exit(0);
                      }
                      uStack_b0 = uStack_b0 - 2;
                      bVar27 = true;
                      goto LAB_00103dc4;
                    }
                    if (uVar11 == 0x71) {
                      *(undefined8 *)((long)pfVar17 + -8) = 0x10445c;
                      putchar(10);
                      goto LAB_0010445c;
                    }
LAB_00103f94:
                    if ((byte)(cVar19 - 0x30U) < 10) {
                      channel = (short)uVar11 - 0x2f;
                    }
                    else {
                      if (0x15 < (byte)(cVar19 + 0xbfU)) goto LAB_00104109;
                      channel = (short)uVar11 - 0x36;
                    }
                    if (channel <= (ushort)uStack_68) {
                      uStack_60 = uVar14;
                      *(undefined8 *)((long)pfVar17 + -8) = 0x104046;
                      _Var7 = xm_mute_channel(pxVar3,channel,true);
                      *(undefined8 *)((long)pfVar17 + -8) = 0x104056;
                      xm_mute_channel(pxVar3,channel,!_Var7);
                      _fStack_190 = 0x6e6e616843;
                      uStack_18b = 0x6c65;
                      uStack_189 = 0x203a73;
                      if ((ushort)uStack_68 != 0) {
                        uVar8 = 1;
                        uVar14 = 1;
                        do {
                          pxVar3 = pxStack_48;
                          *(undefined8 *)((long)pfVar17 + -8) = 0x104097;
                          _Var7 = xm_mute_channel(pxVar3,uVar8,true);
                          pxVar3 = pxStack_48;
                          *(undefined8 *)((long)pfVar17 + -8) = 0x1040a9;
                          xm_mute_channel(pxVar3,uVar8,_Var7);
                          cVar19 = '.';
                          if (!_Var7) {
                            cVar19 = "Channels: "[(long)(int)uVar14 + 10];
                          }
                          *(char *)((long)&uStack_189 + uVar14 + 2) = cVar19;
                          uVar8 = uVar8 + 1;
                          uVar14 = (ulong)uVar8;
                        } while (uVar8 <= (ushort)uStack_68);
                      }
                      *(undefined1 *)((long)&uStack_189 + uStack_108 + 3) = 0;
                      uStack_98 = uStack_a0 + uStack_e0;
                      uVar14 = uStack_60;
                    }
                  }
LAB_00104109:
                  pxVar3 = pxStack_48;
                  *(undefined8 *)((long)pfVar17 + -8) = 0x104125;
                  xm_get_position(pxVar3,&bStack_39,&bStack_4a,&bStack_49,&uStack_a0);
                  pxVar3 = pxStack_48;
                  *(undefined8 *)((long)pfVar17 + -8) = 0x104136;
                  xm_get_playing_speed(pxVar3,&uStack_78,&uStack_76);
                  pxVar3 = pxStack_48;
                  bVar5 = bStack_4a;
                  if (uStack_98 < uStack_a0) {
                    uStack_d4 = (uint)uStack_76;
                    uStack_d0 = (uint)uStack_78;
                    uStack_cc = (uint)bStack_39;
                    uStack_138 = (ulong)bStack_49;
                    uStack_60 = uVar14;
                    *(undefined8 *)((long)pfVar17 + -8) = 0x104184;
                    uVar8 = xm_get_number_of_rows(pxVar3,(ushort)bVar5);
                    pxVar3 = pxStack_48;
                    *(undefined8 *)((long)pfVar17 + -8) = 0x10418f;
                    bVar5 = xm_get_loop_count(pxVar3);
                    lStack_130 = (long)((float)uStack_a0 / fStack_c4);
                    uVar14 = (uStack_a0 % uStack_128) / uStack_118;
                    fVar28 = (float)(long)(uStack_a0 % uStack_118) / fStack_c0;
                    uVar24 = (ulong)uStack_d4;
                    uVar18 = (ulong)uStack_d0;
                    uVar20 = (ulong)uStack_cc;
                    uVar26 = (ulong)uStack_c8;
                    *(long *)((long)pfVar17 + -0x10) =
                         (long)(((float)(long)(uStack_a0 % uStack_e0) * 100.0) / fStack_c0);
                    *(long *)((long)pfVar17 + -0x18) = (long)fVar28;
                    *(long *)((long)pfVar17 + -0x20) = (long)(float)(long)uVar14;
                    *(long *)((long)pfVar17 + -0x28) = lStack_130;
                    uVar14 = uStack_60;
                    *(ulong *)((long)pfVar17 + -0x30) = uStack_60;
                    *(ulong *)((long)pfVar17 + -0x38) = (ulong)bVar5;
                    *(ulong *)((long)pfVar17 + -0x40) = (ulong)uVar8;
                    *(ulong *)((long)pfVar17 + -0x48) = uStack_138;
                    *(ulong *)((long)pfVar17 + -0x50) = uStack_120;
                    *(undefined8 *)((long)pfVar17 + -0x58) = 0x1042b9;
                    printf("\rSpd[%.2X/%.2X] Pos[%.2X/%.2X] Pat[%.2X/%.2X] Row[%.2X/%.2X] Loop[%.2X/%.2lX] %.2i:%.2i:%.2i.%.2i\r"
                           ,uVar24,uVar18,uVar20,uVar26);
                  }
                  else {
                    *(undefined8 *)((long)pfVar17 + -8) = 0x1041c1;
                    printf("\r%-*s\r",0x46,&fStack_190);
                  }
                  *(undefined8 *)((long)pfVar17 + -8) = 0x1042d3;
                  fflush(_stdout);
                  pxVar3 = pxStack_48;
                  pfVar21 = pfStack_e8;
                  sVar2 = sStack_f0;
                  bVar27 = bVar4;
                  if ((uStack_70 & 1) == 0) {
                    *(undefined8 *)((long)pfVar17 + -8) = 0x1042ff;
                    xm_generate_samples(pxVar3,pfVar21,sVar2);
                    psVar1 = psStack_b8;
                    if ((uStack_50 & 1) != 0) {
                      uStack_50 = 0;
                      *(undefined8 *)((long)pfVar17 + -8) = 0x10431f;
                      snd_pcm_recover(psVar1,0,0);
                      *(undefined8 *)((long)pfVar17 + -8) = 0x104327;
                      iVar10 = snd_pcm_resume(psVar1);
                      if (iVar10 < 0) {
                        *(undefined8 *)((long)pfVar17 + -8) = 0x104333;
                        iVar10 = snd_pcm_prepare(psVar1);
                        if (iVar10 < 0) {
                          uStack_50 = 0;
                          *(undefined8 *)((long)pfVar17 + -8) = 0x104353;
                          iVar10 = snd_pcm_recover(psVar1,iVar10,0);
                          if (iVar10 < 0) goto LAB_001044a3;
                        }
                        else {
                          uStack_50 = 0;
                        }
                      }
                    }
                    fVar28 = fStack_74;
                    format_00 = sStack_bc;
                    pfVar21 = pfStack_e8;
                    sVar2 = sStack_f0;
                    alsabuffer_00 = puStack_110;
                    *(undefined8 *)((long)pfVar17 + -8) = 0x104383;
                    play_floatbuffer(psVar1,format_00,sVar2,fVar28,pfVar21,alsabuffer_00);
                  }
                  else {
                    *(undefined8 *)((long)pfVar17 + -8) = 0x1042e3;
                    usleep(10000);
                  }
                }
              } while( true );
            }
            *(undefined8 *)((long)pfVar17 + -8) = 0x103d38;
            iVar10 = snd_pcm_recover(psVar1,iVar10,0);
            if (-1 < iVar10) goto LAB_00103d40;
            goto LAB_0010447e;
          }
          *(undefined8 *)((long)pfVar17 + -8) = 0x1043f2;
          main_cold_13();
          goto LAB_001043cd;
        }
LAB_00104417:
        *(undefined8 *)((long)pfVar17 + -8) = 0x104426;
        iVar10 = snd_pcm_close(psStack_f8);
        if (-1 < iVar10) {
          return;
        }
        *(undefined8 *)((long)pfVar17 + -8) = 0x104436;
        iVar10 = snd_pcm_recover(psStack_f8,iVar10,0);
        if (-1 < iVar10) {
          return;
        }
        goto LAB_001044b1;
      }
    }
  }
LAB_00104490:
  *(undefined8 *)((long)pfVar21 + -8) = 0x104498;
  main_cold_15();
LAB_00104498:
  pfVar17 = pfVar21;
  *(undefined8 *)((long)pfVar17 + -8) = 0x1044a3;
  main_cold_1();
LAB_001044a3:
  *(undefined8 *)((long)pfVar17 + -8) = 0x1044aa;
  main_cold_10();
LAB_001044aa:
  *(undefined8 *)((long)pfVar17 + -8) = 0x1044b1;
  main_cold_9();
LAB_001044b1:
  *(code **)((long)pfVar17 + -8) = restoreterm;
  main_cold_14();
  tcsetattr(0,0,(termios *)&previousflags);
  return;
LAB_00104388:
  uStack_60 = uVar14;
  *(undefined8 *)((long)pfVar17 + -8) = 0x104396;
  putchar(10);
  psVar1 = psStack_b8;
  *(undefined8 *)((long)pfVar17 + -8) = 0x1043a5;
  iVar10 = snd_pcm_drop(psVar1);
  uVar14 = uStack_b0;
  if (-1 < iVar10) {
LAB_001043c4:
    pxVar3 = pxStack_48;
    *(undefined8 *)((long)pfVar17 + -8) = 0x1043cd;
    xm_free_context(pxVar3);
LAB_001043cd:
    uVar14 = uVar14 + 1;
    if (uStack_80 <= uVar14) goto LAB_00104417;
    goto LAB_00103be5;
  }
  *(undefined8 *)((long)pfVar17 + -8) = 0x1043bc;
  iVar10 = snd_pcm_recover(psVar1,iVar10,0);
  if (-1 < iVar10) goto LAB_001043c4;
LAB_00104477:
  *(undefined8 *)((long)pfVar17 + -8) = 0x10447e;
  main_cold_11();
LAB_0010447e:
  *(undefined8 *)((long)pfVar17 + -8) = 0x104485;
  main_cold_12();
LAB_00104485:
  *(undefined8 *)((long)pfVar17 + -8) = 0x104490;
  main_cold_2();
  pfVar21 = pfVar17;
  goto LAB_00104490;
}

Assistant:

void play_floatbuffer(snd_pcm_t* device, snd_pcm_format_t format, size_t period_size, float preamp,
                   float* buffer, void* alsabuffer) {
	if(format == SND_PCM_FORMAT_FLOAT && preamp == 1.f) {
		CHECK_ALSA_CALL(snd_pcm_writei(device, buffer, period_size));
	} else {
		const unsigned int channels = 2;

		if(format == SND_PCM_FORMAT_S16) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int16_t*)alsabuffer)[i] = (int16_t)(CLAMP((double)buffer[i] * preamp) * 32767.);
			}
		} else if(format == SND_PCM_FORMAT_S32) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((int32_t*)alsabuffer)[i] = (int32_t)(CLAMP((double)buffer[i] * preamp) * 2147483647.);
			}
		} else if(format == SND_PCM_FORMAT_FLOAT) {
			for(size_t i = 0; i < period_size * channels; ++i) {
				((float*)alsabuffer)[i] = buffer[i] * preamp;
			}
		}

		CHECK_ALSA_CALL(snd_pcm_writei(device, alsabuffer, period_size));
	}
}